

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O3

pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall
helics::BrokerBase::processBaseCommands
          (pair<bool,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           *__return_storage_ptr__,BrokerBase *this,ActionMessage *command)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  GlobalFederateId federateID;
  string_viewOps *__n_00;
  byte *__s;
  size_t __n_01;
  long *__s1;
  ulong uVar5;
  int *piVar6;
  element_type *peVar7;
  string_view quoteChars;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view level;
  pointer pbVar8;
  int iVar9;
  LogLevels level_00;
  void *pvVar10;
  string *psVar11;
  unsigned_long newSize;
  char *in_RCX;
  uint *defValue;
  LogManager *this_00;
  size_type __n;
  size_type __rlen;
  string_view trimCharacters;
  string_view line;
  string_view str;
  string_view str_00;
  string_view V;
  string_view V_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_viewVector res;
  ActionMessage udisconnect;
  size_t sVar12;
  char *pcVar13;
  string_viewVector local_140;
  string_viewOps *local_128;
  byte *local_120;
  size_t local_118;
  byte *pbStack_110;
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  char *pcStack_f0;
  undefined1 local_e8 [16];
  pointer local_d8;
  
  __n_00 = (string_viewOps *)(command->payload).bufferSize;
  __s = (command->payload).heap;
  local_128 = __n_00;
  local_120 = __s;
  if (__n_00 != (string_viewOps *)0x0) {
    pvVar10 = memchr(__s,0x23,(size_t)__n_00);
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pvVar10 == (void *)0x0);
    if (((long)pvVar10 - (long)__s != -1 && pvVar10 != (void *)0x0) &&
       (local_128 = (string_viewOps *)(((long)pvVar10 - (long)__s) - 1), __n_00 < local_128)) {
      local_128 = __n_00;
    }
  }
  trimCharacters._M_str = in_RCX;
  trimCharacters._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_128,(string_view *)0x4,trimCharacters);
  sVar12 = 3;
  pcVar13 = (char *)0x3d5e4f;
  quoteChars._M_str = (char *)0x3d5e4f;
  quoteChars._M_len = 3;
  line._M_str = (char *)0x2;
  line._M_len = (size_t)local_120;
  gmlc::utilities::string_viewOps::splitlineQuotes
            (&local_140,local_128,line,(string_view)ZEXT816(0x3da9b8),quoteChars,
             (delimiter_compression)this);
  pbVar8 = local_140.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_140.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_140.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e8 = (undefined1  [16])0x0;
    local_d8 = (pointer)0x0;
    __return_storage_ptr__->first = true;
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&__return_storage_ptr__->second,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_e8);
    if ((pointer)local_e8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_e8._0_8_,(long)local_d8 - local_e8._0_8_);
    }
    goto LAB_002a34b4;
  }
  __n_01 = (local_140.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_len;
  if (__n_01 - 3 < 7) {
    __s1 = (long *)(local_140.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_str;
    defValue = &switchD_002a30f8::switchdataD_003e93b8;
    switch(__n_01) {
    case 3:
      iVar9 = bcmp(__s1,"log",__n_01);
      if (iVar9 == 0) {
        if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
          federateID.gid = (this->global_broker_id_local).gid;
          psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
          uVar5 = (command->payload).bufferSize;
          if (uVar5 < 4) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",4);
          }
          local_118 = uVar5 - 4;
          pbStack_110 = (command->payload).heap + 4;
          message._M_str = (char *)pbStack_110;
          message._M_len = local_118;
          name._M_str = (psVar11->_M_dataplus)._M_p;
          name._M_len = psVar11->_M_string_length;
          sendToLogger(this,federateID,6,name,message,false);
        }
        goto LAB_002a34a3;
      }
      break;
    case 4:
      iVar9 = bcmp(__s1,"echo",__n_01);
      if (iVar9 == 0) {
        if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
          local_108 = 0x2e;
          pcStack_100 = " received echo command via command instruction";
          message_00._M_str = " received echo command via command instruction";
          message_00._M_len = 0x2e;
          name_00._M_str = (this->identifier)._M_dataplus._M_p;
          name_00._M_len = (this->identifier)._M_string_length;
          sendToLogger(this,(GlobalFederateId)(this->global_broker_id_local).gid,6,name_00,
                       message_00,false);
        }
        uVar1 = command->source_id;
        uVar2 = command->source_handle;
        uVar3 = command->dest_id;
        uVar4 = command->dest_handle;
        command->source_id = (GlobalFederateId)uVar3;
        command->source_handle = (InterfaceHandle)uVar4;
        command->dest_id = (GlobalFederateId)uVar1;
        command->dest_handle = (InterfaceHandle)uVar2;
        SmallBuffer::operator=(&command->payload,(char (*) [11])"echo_reply");
        psVar11 = ActionMessage::getString_abi_cxx11_(command,1);
        str._M_str = (psVar11->_M_dataplus)._M_p;
        str._M_len = psVar11->_M_string_length;
        ActionMessage::setString(command,0,str);
        str_00._M_str = (this->identifier)._M_dataplus._M_p;
        str_00._M_len = (this->identifier)._M_string_length;
        ActionMessage::setString(command,1,str_00);
        addActionMessage(this,command);
        goto LAB_002a34a3;
      }
      break;
    case 6:
      if (*(short *)((long)__s1 + 4) == 0x6572 && (int)*__s1 == 0x6f6e6769) goto LAB_002a34a3;
      break;
    case 9:
      iVar9 = bcmp(__s1,"terminate",__n_01);
      if (iVar9 == 0) {
        if (this->allowRemoteControl == true) {
          if (5 < (this->maxLogLevel).super___atomic_base<int>._M_i) {
            local_f8 = 0x37;
            pcStack_f0 = " received terminate instruction via command instruction";
            message_01._M_str = " received terminate instruction via command instruction";
            message_01._M_len = 0x37;
            name_01._M_str = (this->identifier)._M_dataplus._M_p;
            name_01._M_len = (this->identifier)._M_string_length;
            sendToLogger(this,(GlobalFederateId)(this->global_broker_id_local).gid,6,name_01,
                         message_01,false);
          }
          ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_user_disconnect);
          addActionMessage(this,(ActionMessage *)local_e8);
          ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        }
      }
      else {
        iVar9 = bcmp(__s1,"logbuffer",__n_01);
        if (iVar9 == 0) {
          if (0x10 < (ulong)((long)local_140.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
            if (((utilities *)pbVar8[1]._M_len != (utilities *)0x4) ||
               (*(int *)pbVar8[1]._M_str != 0x706f7473)) {
              peVar7 = (this->mLogManager).
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              V_00._M_str = (char *)0xa;
              V_00._M_len = (size_t)pbVar8[1]._M_str;
              newSize = gmlc::utilities::numeric_conversion<unsigned_long>
                                  ((utilities *)pbVar8[1]._M_len,V_00,(unsigned_long)defValue);
              LogBuffer::resize(&peVar7->mLogBuffer,newSize);
              goto LAB_002a34a3;
            }
          }
          LogBuffer::enable(&((this->mLogManager).
                              super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->mLogBuffer,
                            (ulong)((long)local_140.
                                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)
                            < 0x11);
        }
        else {
          if ((char)__s1[1] != 'g' || *__s1 != 0x6f6c65746f6d6572) break;
          if ((ulong)((long)local_140.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8) < 0x11) {
            this_00 = (this->mLogManager).
                      super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar9 = this_00->consoleLogLevel;
LAB_002a346a:
            LogManager::updateRemote(this_00,(GlobalFederateId)(command->source_id).gid,iVar9);
          }
          else {
            piVar6 = (int *)pbVar8[1]._M_str;
            if (((utilities *)pbVar8[1]._M_len == (utilities *)0x4) && (*piVar6 == 0x706f7473)) {
              this_00 = (this->mLogManager).
                        super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar9 = -4;
              goto LAB_002a346a;
            }
            if ((int)(char)*piVar6 - 0x30U < 10) {
              V._M_str = (char *)0xfffffffc;
              V._M_len = (size_t)piVar6;
              level_00 = gmlc::utilities::numeric_conversion<int>((utilities *)pbVar8[1]._M_len,V,0)
              ;
            }
            else {
              level._M_str = pcVar13;
              level._M_len = sVar12;
              level_00 = logLevelFromString(level);
            }
            LogManager::updateRemote
                      ((this->mLogManager).
                       super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (GlobalFederateId)(command->source_id).gid,level_00);
          }
          LOCK();
          (this->maxLogLevel).super___atomic_base<int>._M_i =
               (((this->mLogManager).
                 super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               maxLogLevel).super___atomic_base<int>._M_i;
          UNLOCK();
        }
      }
LAB_002a34a3:
      __return_storage_ptr__->first = true;
      CLI::std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::vector(&__return_storage_ptr__->second,&local_140);
      goto LAB_002a34b4;
    }
  }
  __return_storage_ptr__->first = false;
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&local_140);
LAB_002a34b4:
  if (local_140.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::vector<std::string_view>>
    BrokerBase::processBaseCommands(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " |",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return {true, {}};
    }
    if (res[0] == "ignore") {
    } else if (res[0] == "terminate") {
        if (allowRemoteControl) {
            LOG_SUMMARY(global_broker_id_local,
                        identifier,
                        " received terminate instruction via command instruction")
            const ActionMessage udisconnect(CMD_USER_DISCONNECT);
            addActionMessage(udisconnect);
        }
    } else if (res[0] == "echo") {
        LOG_SUMMARY(global_broker_id_local,
                    identifier,
                    " received echo command via command instruction")
        command.swapSourceDest();
        command.payload = "echo_reply";
        command.setString(targetStringLoc, command.getString(sourceStringLoc));
        command.setString(sourceStringLoc, identifier);
        addActionMessage(command);
    } else if (res[0] == "log") {
        LOG_SUMMARY(global_broker_id_local,
                    command.getString(sourceStringLoc),
                    command.payload.to_string().substr(4));
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLogLevel = HELICS_LOG_LEVEL_NO_PRINT;
                if (isdigit(res[1][0]) != 0) {
                    newLogLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1], HELICS_LOG_LEVEL_NO_PRINT);
                } else {
                    newLogLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLogLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel.store(mLogManager->getMaxLevel());
    } else {
        return {false, res};
    }
    return {true, res};
}